

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<long_double>_>::Inverse
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *Inv,
          DecomposeType dec)

{
  long lVar1;
  complex<long_double> *pcVar2;
  _func_int **pp_Var3;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  undefined8 uVar7;
  long lVar8;
  
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  if (lVar1 != 0) {
    if (lVar1 == (this->super_TPZBaseMatrix).fCol) {
      (*(Inv->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xe])(Inv,lVar1,lVar1);
      (*(Inv->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xf])(Inv);
      if (0 < lVar1) {
        lVar8 = 0;
        do {
          lVar5 = (Inv->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
          if ((lVar5 <= lVar8) ||
             ((Inv->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <= lVar8))
          {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar5 = lVar5 * lVar8;
          pcVar2 = Inv->fElem;
          *(longdouble *)pcVar2[lVar5 + lVar8]._M_value = (longdouble)1;
          *(longdouble *)(pcVar2[lVar5 + lVar8]._M_value + 0x10) = (longdouble)0;
          lVar8 = lVar8 + 1;
        } while (lVar1 != lVar8);
      }
      pp_Var3 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
      if (dec == ENoDecompose) {
        iVar4 = (*pp_Var3[0x10])(this);
        UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x41];
        if (iVar4 == 0) {
          uVar7 = 1;
        }
        else {
          uVar7 = 4;
        }
        iVar4 = (*UNRECOVERED_JUMPTABLE)(this,Inv,uVar7,UNRECOVERED_JUMPTABLE);
        return iVar4;
      }
      (*pp_Var3[0x41])(this,Inv);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "int TPZMatrix<std::complex<long double>>::Inverse(TPZFMatrix<TVar> &, DecomposeType) [T = std::complex<long double>]"
                 ,0x74);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," - matrix must be square - Rows() = ",0x24);
      poVar6 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," - Cols() = ",0xc);
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
  }
  return 0;
}

Assistant:

const TPZFMatrix<TVar> TPZMatrix<TVar>::Storage() const
{
  const auto size = Size();
  const auto elem = Elem();
	TPZFMatrix<TVar> ref(size,1,const_cast<TVar*>(elem),size);
	return ref;
}